

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<char16_t_const*,ThreadContext::SourceDynamicProfileManagerCache*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<char16_t_const*,ThreadContext::SourceDynamicProfileManagerCache*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<char16_t_const*,ThreadContext::SourceDynamicProfileManagerCache*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,char16_t **key,SourceDynamicProfileManagerCache **value)

{
  Type *pTVar1;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
  *pSVar2;
  SourceDynamicProfileManagerCache *pSVar3;
  int *piVar4;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
  *pSVar5;
  code *pcVar6;
  WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache> WVar7;
  WriteBarrierPtr<const_char16_t> WVar8;
  BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar9;
  bool bVar10;
  int iVar11;
  char16_t *pcVar12;
  undefined4 *puVar13;
  long lVar14;
  char16_t cVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  WriteBarrierPtr<const_char16_t> *addr;
  uint uVar19;
  hash_t hashCode;
  WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache> local_68;
  WriteBarrierPtr<const_char16_t> local_60;
  SourceDynamicProfileManagerCache **local_58;
  ulong local_50;
  long local_48;
  BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_40;
  uint local_34;
  
  lVar14 = *(long *)this;
  if (lVar14 == 0) {
    BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar14 = *(long *)this;
  }
  pcVar12 = *key;
  cVar15 = *pcVar12;
  if (cVar15 == L'\0') {
    hashCode = 0x2393b8b;
  }
  else {
    uVar17 = 0x811c9dc5;
    do {
      pcVar12 = pcVar12 + 1;
      uVar18 = (ushort)cVar15 ^ uVar17;
      uVar17 = uVar18 * 0x1000193;
      cVar15 = *pcVar12;
    } while (cVar15 != L'\0');
    hashCode = uVar18 * 0x2000326 + 1;
  }
  local_58 = value;
  local_34 = BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar17 = *(uint *)(lVar14 + (ulong)local_34 * 4);
  local_40 = (BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)this;
  if ((int)uVar17 < 0) {
    uVar19 = 0;
  }
  else {
    lVar14 = *(long *)(this + 8);
    uVar19 = 0;
    do {
      iVar11 = PAL_wcscmp(*(char16_t **)(lVar14 + 0x10 + (ulong)uVar17 * 0x18),*key);
      if (iVar11 == 0) {
        if (local_40->stats != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(local_40->stats,uVar19);
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
        if (bVar10) {
          *puVar13 = 0;
          return -1;
        }
        goto LAB_007c734a;
      }
      uVar19 = uVar19 + 1;
      uVar17 = *(uint *)(lVar14 + (ulong)uVar17 * 0x18 + 8);
    } while (-1 < (int)uVar17);
  }
  pBVar9 = local_40;
  if (local_40->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_40->stats,uVar19);
  }
  if (pBVar9->freeCount == 0) {
    uVar17 = pBVar9->size;
    uVar18 = pBVar9->count;
    if (uVar18 == uVar17) {
      BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize(pBVar9);
      local_34 = BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetBucket(hashCode,pBVar9->bucketCount,pBVar9->modFunctionIndex);
      uVar17 = pBVar9->size;
      uVar18 = pBVar9->count;
    }
    uVar16 = (ulong)uVar18;
    pBVar9->count = uVar18 + 1;
    if ((int)uVar17 < (int)(uVar18 + 1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3f1,"(count <= size)","count <= size");
      if (!bVar10) goto LAB_007c734a;
      *puVar13 = 0;
      uVar17 = pBVar9->size;
    }
    if ((int)uVar17 <= (int)uVar18) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3f2,"(index < size)","index < size");
      if (!bVar10) goto LAB_007c734a;
      *puVar13 = 0;
    }
  }
  else {
    if (pBVar9->freeCount < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar10) goto LAB_007c734a;
      *puVar13 = 0;
    }
    uVar17 = pBVar9->freeList;
    if ((int)uVar17 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar10) goto LAB_007c734a;
      *puVar13 = 0;
      uVar17 = pBVar9->freeList;
    }
    if (pBVar9->count <= (int)uVar17) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar10) {
LAB_007c734a:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar13 = 0;
      uVar17 = pBVar9->freeList;
    }
    uVar16 = (ulong)uVar17;
    pTVar1 = &pBVar9->freeCount;
    *pTVar1 = *pTVar1 + -1;
    if (*pTVar1 != 0) {
      iVar11 = BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetNextFreeEntryIndex((pBVar9->entries).ptr + (int)uVar17);
      pBVar9->freeList = iVar11;
    }
  }
  pSVar2 = (local_40->entries).ptr;
  lVar14 = (long)(int)uVar16;
  pSVar5 = pSVar2 + lVar14;
  pcVar12 = *key;
  local_50 = uVar16;
  local_48 = lVar14;
  Memory::Recycler::WBSetBit((char *)&local_60);
  local_60.ptr = pcVar12;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
  pSVar3 = *local_58;
  Memory::Recycler::WBSetBit((char *)&local_68);
  local_68.ptr = pSVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
  WVar7.ptr = local_68.ptr;
  Memory::Recycler::WBSetBit((char *)pSVar5);
  pSVar2 = pSVar2 + lVar14;
  addr = &(pSVar2->
          super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          ).
          super_KeyValueEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
          .
          super_ValueEntry<Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>_>
          .
          super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
          .key;
  (pSVar2->
  super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  ).
  super_KeyValueEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
  .
  super_ValueEntry<Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>_>
  .
  super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
  .value.ptr = WVar7.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar5);
  WVar8.ptr = local_60.ptr;
  Memory::Recycler::WBSetBit((char *)addr);
  pBVar9 = local_40;
  uVar16 = local_50;
  addr->ptr = WVar8.ptr;
  iVar11 = (int)local_50;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  piVar4 = (pBVar9->buckets).ptr;
  pSVar5 = (pBVar9->entries).ptr;
  pSVar5[lVar14].
  super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  .
  super_KeyValueEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
  .
  super_ValueEntry<Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>_>
  .
  super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
  .next = piVar4[local_34];
  piVar4[local_34] = (int)local_48;
  uVar19 = 0;
  uVar16 = uVar16 & 0xffffffff;
  do {
    uVar17 = pSVar5[(int)uVar16].
             super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .
             super_KeyValueEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
             .
             super_ValueEntry<Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>_>
             .
             super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
             .next;
    uVar16 = (ulong)uVar17;
    uVar19 = uVar19 + 1;
  } while (uVar17 != 0xffffffff);
  if (pBVar9->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(pBVar9->stats,uVar19);
  }
  return iVar11;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }